

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_preprocessAndSolveReal
          (SoPlexBase<double> *this,bool applySimplifier,bool *interrupt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  double *pdVar5;
  byte in_SIL;
  time_t *__timer;
  SoPlexBase<double> *in_RDI;
  double dVar6;
  Real RVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  bool *in_stack_00000098;
  Real remainingTime;
  bool keepbounds;
  Result simplificationStatus;
  bool copyLP;
  SPxSolverBase<double> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar8;
  SPxSolverBase<double> *in_stack_ffffffffffffff40;
  SPxSimplifier<double> *pSVar9;
  SoPlexBase<double> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  SPxLPBase<double> **in_stack_ffffffffffffff70;
  SPxLPBase<double> *in_stack_ffffffffffffff88;
  Result simplificationStatus_00;
  SoPlexBase<double> *in_stack_ffffffffffffff90;
  double local_68;
  SPxSolverBase<double> *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  SPxSolverBase<double> *this_00;
  double local_40;
  double local_38;
  byte local_29;
  int local_28;
  byte local_21;
  Real local_20 [2];
  byte local_9;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_9 = in_SIL & 1;
  this_00 = &in_RDI->_solver;
  local_20[0] = realParam(in_RDI,OBJ_OFFSET);
  SPxLPBase<double>::changeObjOffset<double>(&this_00->super_SPxLPBase<double>,local_20);
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[3])();
  in_RDI->_applyPolishing = false;
  if ((local_9 & 1) == 0) {
    _disableSimplifierAndScaler(in_RDI);
  }
  else {
    _enableSimplifierAndScaler(in_stack_ffffffffffffff50);
  }
  bVar8 = 1;
  if ((in_RDI->_simplifier == (SPxSimplifier<double> *)0x0) &&
     (in_stack_ffffffffffffffae = 0, bVar8 = in_stack_ffffffffffffffae,
     in_RDI->_scaler != (SPxScaler<double> *)0x0)) {
    in_stack_ffffffffffffffae = in_RDI->_isRealLPScaled ^ 0xff;
    bVar8 = in_stack_ffffffffffffffae;
  }
  local_21 = bVar8 & 1;
  bVar1 = SPxSolverBase<double>::isTerminationValueEnabled(&in_RDI->_solver);
  if (bVar1) {
    in_stack_ffffffffffffffa0 = &in_RDI->_solver;
    iVar2 = intParam(in_RDI,OBJSENSE);
    if (iVar2 == -1) {
      local_68 = realParam(in_RDI,OBJLIMIT_UPPER);
    }
    else {
      local_68 = realParam(in_RDI,OBJLIMIT_LOWER);
    }
    SPxSolverBase<double>::setTerminationValue(in_stack_ffffffffffffffa0,local_68);
  }
  else {
    in_stack_ffffffffffffff90 = (SoPlexBase<double> *)&in_RDI->_solver;
    pdVar5 = (double *)infinity();
    SPxSolverBase<double>::setTerminationValue
              ((SPxSolverBase<double> *)in_stack_ffffffffffffff90,*pdVar5);
    SPxSolverBase<double>::toggleTerminationValue(&in_RDI->_solver,true);
  }
  simplificationStatus_00 = (Result)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
    bVar1 = SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0);
    if ((in_RDI->_hasBasis & 1U) == 0) {
      SPxSolverBase<double>::loadLP
                (in_stack_ffffffffffffff40,
                 (SPxLPBase<double> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                 bVar1);
    }
    else {
      SPxSolverBase<double>::loadLP
                (in_stack_ffffffffffffff40,
                 (SPxLPBase<double> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                 bVar1);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusRows);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusCols);
      SPxSolverBase<double>::setBasis
                (this_00,(VarStatus *)
                         CONCAT17(bVar8,CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )),(VarStatus *)in_stack_ffffffffffffffa0);
    }
    if ((local_21 & 1) == 0) {
      (**(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
         super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)();
      spx_free<soplex::SPxLPBase<double>*>((SPxLPBase<double> **)0x459ca5);
      in_RDI->_realLP = &(in_RDI->_solver).super_SPxLPBase<double>;
      in_RDI->_isRealLPLoaded = true;
    }
  }
  else {
    if ((local_21 & 1) != 0) {
      in_RDI->_realLP = (SPxLPBase<double> *)0x0;
      spx_alloc<soplex::SPxLPBase<double>*>(in_stack_ffffffffffffff70,iVar3);
      in_stack_ffffffffffffff88 = in_RDI->_realLP;
      SPxLPBase<double>::SPxLPBase
                (&in_stack_ffffffffffffff40->super_SPxLPBase<double>,
                 (SPxLPBase<double> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38))
      ;
      in_RDI->_realLP = in_stack_ffffffffffffff88;
      in_RDI->_isRealLPLoaded = false;
    }
    simplificationStatus_00 = (Result)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  }
  local_28 = 0;
  if (in_RDI->_simplifier == (SPxSimplifier<double> *)0x0) goto LAB_00459f38;
  iVar3 = intParam(in_RDI,RATIOTESTER);
  local_29 = iVar3 == 3;
  iVar3 = intParam(in_RDI,REPRESENTATION);
  if (iVar3 == 2) {
LAB_00459dac:
    __timer = (time_t *)0x8;
    bVar1 = boolParam(in_RDI,ROWBOUNDFLIPS);
    local_29 = (local_29 & 1 & bVar1) != 0;
  }
  else {
    __timer = (time_t *)0x1;
    iVar3 = intParam(in_RDI,REPRESENTATION);
    if (iVar3 == 0) {
      iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x459d53);
      dVar6 = (double)(iVar3 + 1);
      __timer = (time_t *)0x10;
      RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
      dVar6 = dVar6 * RVar7;
      iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x459d99);
      if (dVar6 < (double)(iVar3 + 1)) goto LAB_00459dac;
    }
  }
  in_stack_ffffffffffffff30 =
       (SPxSolverBase<double> *)SPxSolverBase<double>::getMaxTime(&in_RDI->_solver);
  SPxSolverBase<double>::time(&in_RDI->_solver,__timer);
  dVar6 = (double)in_stack_ffffffffffffff30 - extraout_XMM0_Qa;
  pSVar9 = in_RDI->_simplifier;
  bVar8 = local_29;
  local_38 = dVar6;
  uVar4 = Random::getSeed(&(in_RDI->_solver).random);
  local_28 = (*pSVar9->_vptr_SPxSimplifier[5])
                       (dVar6,pSVar9,&in_RDI->_solver,(ulong)(bVar8 & 1),(ulong)uVar4);
  (*in_RDI->_simplifier->_vptr_SPxSimplifier[0x10])();
  RVar7 = realParam(in_RDI,OBJ_OFFSET);
  local_40 = extraout_XMM0_Qa_00 + RVar7;
  SPxLPBase<double>::changeObjOffset<double>(&(in_RDI->_solver).super_SPxLPBase<double>,&local_40);
  SPxLPBase<double>::setScalingInfo(&(in_RDI->_solver).super_SPxLPBase<double>,false);
  in_RDI->_applyPolishing = true;
  SPxSolverBase<double>::setSolutionPolishing(&in_RDI->_solver,POLISH_OFF);
LAB_00459f38:
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (local_28 == 0) {
    if ((in_RDI->_scaler != (SPxScaler<double> *)0x0) &&
       (bVar1 = SPxLPBase<double>::isScaled(&(in_RDI->_solver).super_SPxLPBase<double>), !bVar1)) {
      (*in_RDI->_scaler->_vptr_SPxScaler[0xd])(in_RDI->_scaler,&in_RDI->_solver,0);
      SPxSolverBase<double>::invalidateBasis(in_stack_ffffffffffffff30);
    }
    _solveRealLPAndRecordStatistics((SoPlexBase<double> *)remainingTime,in_stack_00000098);
  }
  _evaluateSolutionReal(in_stack_ffffffffffffff90,simplificationStatus_00);
  return;
}

Assistant:

void SoPlexBase<R>::_preprocessAndSolveReal(bool applySimplifier, volatile bool* interrupt)
{
   _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
   _statistics->preprocessingTime->start();

   _applyPolishing = false;

   if(applySimplifier)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

   // create a copy of the LP when simplifying or when using internal scaling, i.e. w/o persistent scaling
   bool copyLP = (_simplifier != nullptr || (_scaler && !_isRealLPScaled));

   // set the objective limit if it was not explicitly disabled for this particular solving call
   if(_solver.isTerminationValueEnabled())
   {
      _solver.setTerminationValue(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                                  ? realParam(SoPlexBase<R>::OBJLIMIT_UPPER) : realParam(SoPlexBase<R>::OBJLIMIT_LOWER));
   }
   // reset the objective limit and reenabled it for the next solve
   else
   {
      _solver.setTerminationValue();
      _solver.toggleTerminationValue(true);
   }

   if(_isRealLPLoaded)
   {
      assert(_realLP == &_solver);

      // preprocessing is always applied to the LP in the solver; hence we have to create a copy of the original LP
      // if simplifier is turned on
      if(copyLP)
      {
         _realLP = nullptr;
         spx_alloc(_realLP);
         _realLP = new(_realLP) SPxLPBase<R>(_solver);
         _isRealLPLoaded = false;
      }
   }
   else
   {
      assert(_realLP != &_solver);

      // load real LP and basis if available
      if(_hasBasis)
      {
         assert(_basisStatusRows.size() == numRows());
         assert(_basisStatusCols.size() == this->numCols());

         _solver.loadLP(*_realLP, false);
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      }
      // load real LP and set up slack basis
      else
         _solver.loadLP(*_realLP, true);

      // if there is no simplifier, then the original and the transformed problem are identical and it is more
      // memory-efficient to keep only the problem in the solver
      if(!copyLP)
      {
         _realLP->~SPxLPBase<R>();
         spx_free(_realLP);
         _realLP = &_solver;
         _isRealLPLoaded = true;
      }
   }

   // assert that we have two problems if and only if we apply the simplifier
   assert(_realLP == &_solver || copyLP);
   assert(_realLP != &_solver || !copyLP);

   // apply problem simplification
   typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

   if(_simplifier)
   {
      assert(!_isRealLPLoaded);
      // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used; also respect row-boundflip parameter
      bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

      if(intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
         keepbounds &= boolParam(SoPlexBase<R>::ROWBOUNDFLIPS);

      Real remainingTime = _solver.getMaxTime() - _solver.time();
      simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                             _solver.random.getSeed());
      _solver.changeObjOffset(_simplifier->getObjoffset() + realParam(SoPlexBase<R>::OBJ_OFFSET));
      _solver.setScalingInfo(false);
      _applyPolishing = true;

      _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
   }

   _statistics->preprocessingTime->stop();

   // run the simplex method if problem has not been solved by the simplifier
   if(simplificationStatus == SPxSimplifier<R>::OKAY)
   {
      if(_scaler && !_solver.isScaled())
      {
         _scaler->scale(_solver, false);
         _solver.invalidateBasis();
      }

      _solveRealLPAndRecordStatistics(interrupt);
   }

   _evaluateSolutionReal(simplificationStatus);
}